

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

void duckdb::ListFinalize
               (Vector *states_vector,AggregateInputData *aggr_input_data,Vector *result,idx_t count
               ,idx_t offset)

{
  long lVar1;
  FunctionData *pFVar2;
  long *plVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Vector *pVVar4;
  byte bVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long *plVar14;
  UnifiedVectorFormat states_data;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  ulong local_90;
  Vector *local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)states_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  lVar1 = *(long *)(result + 0x20);
  uVar8 = duckdb::ListVector::GetListSize(result);
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  pFVar2 = (aggr_input_data->bind_data).ptr;
  if (count != 0) {
    local_88 = result + 0x30;
    plVar14 = (long *)(offset * 0x10 + lVar1 + 8);
    uVar12 = 0;
    local_90 = count;
    do {
      uVar13 = uVar12;
      if (*local_78 != 0) {
        uVar13 = (ulong)*(uint *)(*local_78 + uVar12 * 4);
      }
      plVar3 = *(long **)(local_70 + uVar13 * 8);
      plVar14[-1] = uVar8;
      lVar1 = *plVar3;
      if (lVar1 == 0) {
        _Var10._M_head_impl = *(unsigned_long **)(result + 0x28);
        if (_Var10._M_head_impl == (unsigned_long *)0x0) {
          local_80 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_a8,&local_80);
          p_Var7 = p_Stack_a0;
          uVar6 = local_a8;
          local_a8 = 0;
          p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar6;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var7;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              local_88);
          _Var10._M_head_impl =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var10._M_head_impl;
          count = local_90;
        }
        bVar5 = (byte)(offset + uVar12) & 0x3f;
        _Var10._M_head_impl[offset + uVar12 >> 6] =
             _Var10._M_head_impl[offset + uVar12 >> 6] &
             (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        *plVar14 = 0;
      }
      else {
        *plVar14 = lVar1;
        uVar8 = uVar8 + lVar1;
      }
      uVar12 = uVar12 + 1;
      plVar14 = plVar14 + 2;
    } while (count != uVar12);
  }
  duckdb::ListVector::Reserve(result,uVar8);
  uVar12 = duckdb::ListVector::GetEntry(result);
  if (count != 0) {
    uVar13 = 0;
    do {
      uVar11 = uVar13;
      if (*local_78 != 0) {
        uVar11 = (ulong)*(uint *)(*local_78 + uVar13 * 4);
      }
      pVVar4 = *(Vector **)(local_70 + uVar11 * 8);
      if (*(long *)pVVar4 != 0) {
        duckdb::ListSegmentFunctions::BuildListVector((LinkedList *)(pFVar2 + 0x20),pVVar4,uVar12);
      }
      uVar13 = uVar13 + 1;
    } while (count != uVar13);
  }
  duckdb::ListVector::SetListSize(result,uVar8);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void ListFinalize(Vector &states_vector, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
                         idx_t offset) {

	UnifiedVectorFormat states_data;
	states_vector.ToUnifiedFormat(count, states_data);
	auto states = UnifiedVectorFormat::GetData<ListAggState *>(states_data);

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	auto &mask = FlatVector::Validity(result);
	auto result_data = FlatVector::GetData<list_entry_t>(result);
	size_t total_len = ListVector::GetListSize(result);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();

	// first iterate over all entries and set up the list entries, and get the newly required total length
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[states_data.sel->get_index(i)];
		const auto rid = i + offset;
		result_data[rid].offset = total_len;
		if (state.linked_list.total_capacity == 0) {
			mask.SetInvalid(rid);
			result_data[rid].length = 0;
			continue;
		}

		// set the length and offset of this list in the result vector
		auto total_capacity = state.linked_list.total_capacity;
		result_data[rid].length = total_capacity;
		total_len += total_capacity;
	}

	// reserve capacity, then iterate over all entries again and copy over the data to the child vector
	ListVector::Reserve(result, total_len);
	auto &result_child = ListVector::GetEntry(result);
	for (idx_t i = 0; i < count; i++) {

		auto &state = *states[states_data.sel->get_index(i)];
		const auto rid = i + offset;
		if (state.linked_list.total_capacity == 0) {
			continue;
		}

		idx_t current_offset = result_data[rid].offset;
		list_bind_data.functions.BuildListVector(state.linked_list, result_child, current_offset);
	}

	ListVector::SetListSize(result, total_len);
}